

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O1

bool CSOAA::ec_is_label_definition(example *ec)

{
  uchar *puVar1;
  wclass *pwVar2;
  long lVar3;
  ulong uVar4;
  wclass *pwVar5;
  ulong uVar6;
  bool bVar7;
  
  puVar1 = (ec->super_example_predict).indices._begin;
  if (((ec->super_example_predict).indices._end == puVar1) || (*puVar1 != 'l')) {
    bVar7 = false;
  }
  else {
    pwVar5 = (ec->l).cs.costs._begin;
    lVar3 = (long)(ec->l).cs.costs._end - (long)pwVar5;
    bVar7 = lVar3 == 0;
    if (!bVar7) {
      uVar4 = lVar3 >> 4;
      if (pwVar5->class_index == 0) {
        uVar6 = 1;
        do {
          if (pwVar5->x <= 0.0) {
            return bVar7;
          }
          bVar7 = uVar4 <= uVar6;
          if (uVar4 + (uVar4 == 0) == uVar6) {
            return bVar7;
          }
          uVar6 = uVar6 + 1;
          pwVar2 = pwVar5 + 1;
          pwVar5 = pwVar5 + 1;
        } while (pwVar2->class_index == 0);
      }
    }
  }
  return bVar7;
}

Assistant:

inline size_t size() const { return _end - _begin; }